

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_write_SPCod_SPCoc
                   (opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_no,OPJ_UINT32 p_comp_no,OPJ_BYTE *p_data,
                   OPJ_UINT32 *p_header_size,opj_event_mgr *p_manager)

{
  opj_tccp_t *poVar1;
  uint uVar2;
  uint uVar3;
  undefined4 in_register_00000014;
  OPJ_BYTE *p_buffer;
  ulong uVar4;
  
  p_buffer = (OPJ_BYTE *)CONCAT44(in_register_00000014,p_comp_no);
  if (p_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_size != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x297c,
                  "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
                 );
  }
  if (p_buffer == (OPJ_BYTE *)0x0) {
    __assert_fail("p_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x297e,
                  "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
                 );
  }
  if ((p_j2k->m_cp).th * (p_j2k->m_cp).tw <= p_tile_no) {
    __assert_fail("p_tile_no < (l_cp->tw * l_cp->th)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2985,
                  "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
                 );
  }
  if (p_j2k->m_private_image->numcomps != 0) {
    if (4 < *(uint *)p_data) {
      poVar1 = (p_j2k->m_cp).tcps[p_tile_no].tccps;
      opj_write_bytes_LE(p_buffer,poVar1->numresolutions - 1,1);
      opj_write_bytes_LE(p_buffer + 1,poVar1->cblkw - 2,1);
      opj_write_bytes_LE(p_buffer + 2,poVar1->cblkh - 2,1);
      opj_write_bytes_LE(p_buffer + 3,poVar1->cblksty,1);
      opj_write_bytes_LE(p_buffer + 4,poVar1->qmfbid,1);
      uVar2 = *(int *)p_data - 5;
      *(uint *)p_data = uVar2;
      if ((poVar1->csty & 1) == 0) {
        return 1;
      }
      if (poVar1->numresolutions <= uVar2) {
        if (poVar1->numresolutions == 0) {
          uVar3 = 0;
        }
        else {
          uVar4 = 0;
          do {
            opj_write_bytes_LE(p_buffer + uVar4 + 5,poVar1->prch[uVar4] * 0x10 + poVar1->prcw[uVar4]
                               ,1);
            uVar4 = uVar4 + 1;
            uVar3 = poVar1->numresolutions;
          } while (uVar4 < uVar3);
          uVar2 = *(uint *)p_data;
        }
        *(uint *)p_data = uVar2 - uVar3;
        return 1;
      }
    }
    opj_event_msg((opj_event_mgr_t *)p_header_size,1,"Error writing SPCod SPCoc element\n");
    return 0;
  }
  __assert_fail("p_comp_no < (p_j2k->m_private_image->numcomps)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x2986,
                "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *p_j2k,
        OPJ_UINT32 p_tile_no,
        OPJ_UINT32 p_comp_no,
        OPJ_BYTE * p_data,
        OPJ_UINT32 * p_header_size,
        struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 i;
    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    opj_tccp_t *l_tccp = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_header_size != 00);
    assert(p_manager != 00);
    assert(p_data != 00);

    l_cp = &(p_j2k->m_cp);
    l_tcp = &l_cp->tcps[p_tile_no];
    l_tccp = &l_tcp->tccps[p_comp_no];

    /* preconditions again */
    assert(p_tile_no < (l_cp->tw * l_cp->th));
    assert(p_comp_no < (p_j2k->m_private_image->numcomps));

    if (*p_header_size < 5) {
        opj_event_msg(p_manager, EVT_ERROR, "Error writing SPCod SPCoc element\n");
        return OPJ_FALSE;
    }

    opj_write_bytes(p_data, l_tccp->numresolutions - 1, 1); /* SPcoc (D) */
    ++p_data;

    opj_write_bytes(p_data, l_tccp->cblkw - 2, 1);                  /* SPcoc (E) */
    ++p_data;

    opj_write_bytes(p_data, l_tccp->cblkh - 2, 1);                  /* SPcoc (F) */
    ++p_data;

    opj_write_bytes(p_data, l_tccp->cblksty,
                    1);                            /* SPcoc (G) */
    ++p_data;

    opj_write_bytes(p_data, l_tccp->qmfbid,
                    1);                             /* SPcoc (H) */
    ++p_data;

    *p_header_size = *p_header_size - 5;

    if (l_tccp->csty & J2K_CCP_CSTY_PRT) {

        if (*p_header_size < l_tccp->numresolutions) {
            opj_event_msg(p_manager, EVT_ERROR, "Error writing SPCod SPCoc element\n");
            return OPJ_FALSE;
        }

        for (i = 0; i < l_tccp->numresolutions; ++i) {
            opj_write_bytes(p_data, l_tccp->prcw[i] + (l_tccp->prch[i] << 4),
                            1);   /* SPcoc (I_i) */
            ++p_data;
        }

        *p_header_size = *p_header_size - l_tccp->numresolutions;
    }

    return OPJ_TRUE;
}